

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool Curl_clone_ssl_config(ssl_config_data *source,ssl_config_data *dest)

{
  char *pcVar1;
  ssl_config_data *dest_local;
  ssl_config_data *source_local;
  
  dest->sessionid = (_Bool)(source->sessionid & 1);
  dest->verifyhost = (_Bool)(source->verifyhost & 1);
  dest->verifypeer = (_Bool)(source->verifypeer & 1);
  dest->version = source->version;
  if (source->CAfile == (char *)0x0) {
    dest->CAfile = (char *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(source->CAfile);
    dest->CAfile = pcVar1;
    if (dest->CAfile == (char *)0x0) {
      return false;
    }
  }
  if (source->CApath == (char *)0x0) {
    dest->CApath = (char *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(source->CApath);
    dest->CApath = pcVar1;
    if (dest->CApath == (char *)0x0) {
      return false;
    }
  }
  if (source->cipher_list == (char *)0x0) {
    dest->cipher_list = (char *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(source->cipher_list);
    dest->cipher_list = pcVar1;
    if (dest->cipher_list == (char *)0x0) {
      return false;
    }
  }
  if (source->egdsocket == (char *)0x0) {
    dest->egdsocket = (char *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(source->egdsocket);
    dest->egdsocket = pcVar1;
    if (dest->egdsocket == (char *)0x0) {
      return false;
    }
  }
  if (source->random_file == (char *)0x0) {
    dest->random_file = (char *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(source->random_file);
    dest->random_file = pcVar1;
    if (dest->random_file == (char *)0x0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool
Curl_clone_ssl_config(struct ssl_config_data *source,
                      struct ssl_config_data *dest)
{
  dest->sessionid = source->sessionid;
  dest->verifyhost = source->verifyhost;
  dest->verifypeer = source->verifypeer;
  dest->version = source->version;

  if(source->CAfile) {
    dest->CAfile = strdup(source->CAfile);
    if(!dest->CAfile)
      return FALSE;
  }
  else
    dest->CAfile = NULL;

  if(source->CApath) {
    dest->CApath = strdup(source->CApath);
    if(!dest->CApath)
      return FALSE;
  }
  else
    dest->CApath = NULL;

  if(source->cipher_list) {
    dest->cipher_list = strdup(source->cipher_list);
    if(!dest->cipher_list)
      return FALSE;
  }
  else
    dest->cipher_list = NULL;

  if(source->egdsocket) {
    dest->egdsocket = strdup(source->egdsocket);
    if(!dest->egdsocket)
      return FALSE;
  }
  else
    dest->egdsocket = NULL;

  if(source->random_file) {
    dest->random_file = strdup(source->random_file);
    if(!dest->random_file)
      return FALSE;
  }
  else
    dest->random_file = NULL;

  return TRUE;
}